

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

void __thiscall
duckdb_re2::DFA::RunWorkqOnEmptyString(DFA *this,Workq *oldq,Workq *newq,uint32_t flag)

{
  bool bVar1;
  iterator_conflict piVar2;
  Workq *in_RSI;
  Workq *in_RDI;
  iterator i;
  uint32_t in_stack_000001a0;
  int in_stack_000001a4;
  Workq *in_stack_000001a8;
  DFA *in_stack_000001b0;
  int *local_28;
  
  Workq::clear(in_RDI);
  local_28 = SparseSetT<void>::begin((SparseSetT<void> *)0x821fd5);
  while( true ) {
    piVar2 = SparseSetT<void>::end(&in_RDI->super_SparseSet);
    if (local_28 == piVar2) break;
    bVar1 = Workq::is_mark(in_RSI,*local_28);
    if (bVar1) {
      AddToQueue(in_stack_000001b0,in_stack_000001a8,in_stack_000001a4,in_stack_000001a0);
    }
    else {
      AddToQueue(in_stack_000001b0,in_stack_000001a8,in_stack_000001a4,in_stack_000001a0);
    }
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void DFA::RunWorkqOnEmptyString(Workq* oldq, Workq* newq, uint32_t flag) {
  newq->clear();
  for (Workq::iterator i = oldq->begin(); i != oldq->end(); ++i) {
    if (oldq->is_mark(*i))
      AddToQueue(newq, Mark, flag);
    else
      AddToQueue(newq, *i, flag);
  }
}